

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1527.c
# Opt level: O0

size_t read_callback(void *ptr,size_t size,size_t nmemb,void *stream)

{
  size_t sVar1;
  size_t amount;
  void *stream_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  sVar1 = strlen(data);
  if (nmemb * size < sVar1) {
    ptr_local = (void *)strlen(data);
  }
  else {
    sVar1 = strlen(data);
    memcpy(ptr,data,sVar1);
    ptr_local = (void *)strlen(data);
  }
  return (size_t)ptr_local;
}

Assistant:

static size_t read_callback(void *ptr, size_t size, size_t nmemb, void *stream)
{
  size_t  amount = nmemb * size; /* Total bytes curl wants */
  if(amount < strlen(data)) {
    return strlen(data);
  }
  (void)stream;
  memcpy(ptr, data, strlen(data));
  return strlen(data);
}